

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vc1Parser.h
# Opt level: O0

int64_t __thiscall VC1Unit::vc1_unescape_buffer(VC1Unit *this,uint8_t *src,int64_t size)

{
  uint8_t *puVar1;
  long local_38;
  int64_t i;
  int64_t dsize;
  int64_t size_local;
  uint8_t *src_local;
  VC1Unit *this_local;
  
  if (this->m_nalBuffer != (uint8_t *)0x0) {
    operator_delete__(this->m_nalBuffer);
  }
  puVar1 = (uint8_t *)operator_new__(size);
  this->m_nalBuffer = puVar1;
  if (size < 4) {
    std::copy_n<unsigned_char*,long,unsigned_char*>(src,size,this->m_nalBuffer);
    this->m_nalBufferLen = size;
    this_local = (VC1Unit *)size;
  }
  else {
    i = 0;
    size_local = (int64_t)src;
    for (local_38 = 0; local_38 < size; local_38 = local_38 + 1) {
      if ((((*(char *)size_local == '\x03') && (1 < local_38)) &&
          (*(char *)(size_local + -1) == '\0')) &&
         (((*(char *)(size_local + -2) == '\0' && (local_38 < size + -1)) &&
          (*(byte *)(size_local + 1) < 4)))) {
        this->m_nalBuffer[i] = *(uint8_t *)(size_local + 1);
        size_local = size_local + 1;
        local_38 = local_38 + 1;
      }
      else {
        this->m_nalBuffer[i] = *(uint8_t *)size_local;
      }
      i = i + 1;
      size_local = size_local + 1;
    }
    this->m_nalBufferLen = i;
    this_local = (VC1Unit *)i;
  }
  return (int64_t)this_local;
}

Assistant:

int64_t vc1_unescape_buffer(uint8_t* src, const int64_t size)
    {
        delete[] m_nalBuffer;
        m_nalBuffer = new uint8_t[size];
        if (size < 4)
        {
            std::copy_n(src, size, m_nalBuffer);
            m_nalBufferLen = size;
            return size;
        }
        int64_t dsize = 0;
        for (int64_t i = 0; i < size; i++, src++)
        {
            if (src[0] == 3 && i >= 2 && !src[-1] && !src[-2] && i < size - 1 && src[1] < 4)
            {
                m_nalBuffer[dsize++] = src[1];
                src++;
                i++;
            }
            else
                m_nalBuffer[dsize++] = *src;
        }
        m_nalBufferLen = dsize;
        return dsize;
    }